

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O1

void __thiscall Fl_Function_Type::write_code2(Fl_Function_Type *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Fl_Type *pFVar4;
  
  pFVar4 = (this->super_Fl_Type).next;
  pcVar3 = "w";
  if (pFVar4 == (Fl_Type *)0x0) {
    bVar1 = true;
  }
  else {
    iVar2 = (this->super_Fl_Type).level;
    bVar1 = pFVar4->level <= iVar2;
    if (iVar2 < pFVar4->level) {
      pcVar3 = "w";
      do {
        iVar2 = (*pFVar4->_vptr_Fl_Type[0x21])(pFVar4);
        if ((iVar2 != 0) && (pFVar4->name_ != (char *)0x0)) {
          pcVar3 = pFVar4->name_;
        }
        pFVar4 = pFVar4->next;
      } while ((pFVar4 != (Fl_Type *)0x0) && ((this->super_Fl_Type).level < pFVar4->level));
    }
  }
  if ((this->super_Fl_Type).name_ == (char *)0x0) {
    if (this->havewidgets != '\0') {
      write_c("  %s->show(argc, argv);\n",pcVar3);
    }
    if (bVar1) {
      indentation = 0;
      return;
    }
    write_c("  return Fl::run();\n");
  }
  else if (((this->havewidgets != '\0') && (this->constructor == '\0')) &&
          (this->return_type == (char *)0x0)) {
    write_c("  return %s;\n",pcVar3);
  }
  if (!bVar1) {
    write_c("}\n");
  }
  indentation = 0;
  return;
}

Assistant:

void Fl_Function_Type::write_code2() {
  Fl_Type *child;
  const char *var = "w";
  char havechildren = 0;
  for (child = next; child && child->level > level; child = child->next) {
    havechildren = 1;
    if (child->is_window() && child->name()) var = child->name();
  }
  
  if (ismain()) {
    if (havewidgets) write_c("  %s->show(argc, argv);\n", var);
    if (havechildren) write_c("  return Fl::run();\n");
  } else if (havewidgets && !constructor && !return_type) {
    write_c("  return %s;\n", var);
  }
  if (havechildren)
    write_c("}\n");
  indentation = 0;
}